

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxCommon.cpp
# Opt level: O0

RuntimeID Jinx::Impl::GetRandomId(void)

{
  uint64_t uVar1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  duration<long,_std::ratio<1L,_1000000000L>_> local_30;
  char local_28 [8];
  HashData hd;
  
  memset(local_28,0,0x20);
  StrCopy(local_28,0x10,"0@@@@UniqueName");
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&local_38);
  local_30.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(&local_38);
  hd.hs._8_8_ = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_30);
  hd.h1 = std::__atomic_base<unsigned_long>::operator++
                    (&CommonData::uniqueId.super___atomic_base<unsigned_long>,0);
  uVar1 = GetHash(local_28,0x20);
  return uVar1;
}

Assistant:

inline_t RuntimeID GetRandomId()
		{
			// Create hash source of current time, a unique id, and a string
			HashData hd;
			memset(&hd, 0, sizeof(hd));
			StrCopy(hd.hs, 16, "0@@@@UniqueName");
			hd.h1 = std::chrono::high_resolution_clock::time_point().time_since_epoch().count();
			hd.h2 = CommonData::uniqueId++;

			// Return a new random Id from unique hash source
			return GetHash(&hd, sizeof(hd));
		}